

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

void Potassco::fail(int ec,char *file,uint line,char *exp,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  overflow_error *this;
  undefined8 uVar2;
  byte bVar3;
  undefined8 uVar4;
  code *pcVar5;
  undefined *puVar6;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  StringBuilder str;
  va_list args;
  char msg [1024];
  anon_union_64_3_812e3e79_for_StringBuilder_0 local_528;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [40];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  string local_418 [32];
  
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4a0 = in_R9;
  if (ec == 0) {
    fail(0x16,
         "void Potassco::fail(int, const char *, unsigned int, const char *, const char *, ...)",
         0x1c4,"ec != 0","error code must not be 0",0);
  }
  local_528.str_ = local_418;
  local_418[0]._M_dataplus._M_p._0_1_ = 0;
  local_528.buf_.used = 0;
  local_528.buf_.size = 0x3ff;
  local_528.sbo_[0x3f] = 0x80;
  if (ec < 1 && ec != -1) {
    if (fmt == (char *)0x0) {
      pcVar1 = "runtime";
      if (ec == -2) {
        pcVar1 = "logic";
      }
      StringBuilder::appendFormat((StringBuilder *)&local_528.buf_,"%s error: ",pcVar1);
      goto LAB_0011ba5a;
    }
LAB_0011ba81:
    local_4d8 = local_4c8;
    local_4e0 = (undefined1 *)((long)&str.field_0 + 8);
    local_4e8 = 0x3000000028;
    bVar3 = local_528.sbo_[0x3f] & 0xc0;
    if (bVar3 == 0x40) {
      uVar2 = (local_528.str_)->_M_string_length;
    }
    else {
      uVar2 = local_528.buf_.used;
      if (bVar3 != 0x80) {
        uVar2 = 0x3f - (ulong)(byte)local_528.sbo_[0x3f];
      }
    }
    if (bVar3 == 0x40) {
      uVar4 = (local_528.str_)->_M_string_length;
    }
    else {
      uVar4 = local_528.buf_.used;
      if (bVar3 != 0x80) {
        uVar4 = 0x3f - (ulong)(byte)local_528.sbo_[0x3f];
      }
    }
    ::vsnprintf((char *)((long)&local_418[0]._M_dataplus._M_p + uVar2),0x400 - uVar4,fmt,&local_4e8)
    ;
  }
  else {
    if (line != 0 && file != (char *)0x0) {
      StringBuilder::appendFormat((StringBuilder *)&local_528.buf_,"%s@%u: ");
    }
    if (ec < 1) {
      pcVar1 = "assertion failure";
    }
    else {
      pcVar1 = strerror(ec);
    }
    StringBuilder::append((StringBuilder *)&local_528.buf_,pcVar1);
    StringBuilder::append((StringBuilder *)&local_528.buf_,": ");
LAB_0011ba5a:
    if (fmt != (char *)0x0) goto LAB_0011ba81;
    if (exp != (char *)0x0) {
      StringBuilder::appendFormat((StringBuilder *)&local_528.buf_,"check(\'%s\') failed",exp);
    }
  }
  if (ec < 0xc) {
    if (-2 < ec) {
      if (ec == -1) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this,(char *)local_418);
LAB_0011bc75:
        pcVar5 = std::logic_error::~logic_error;
        puVar6 = &std::logic_error::typeinfo;
        goto LAB_0011bd3b;
      }
      if (ec == 7) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error((length_error *)this,(char *)local_418);
        pcVar5 = std::length_error::~length_error;
        puVar6 = &std::length_error::typeinfo;
        goto LAB_0011bd3b;
      }
      goto LAB_0011bd10;
    }
    if (ec != -3) {
      if (ec == -2) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this,(char *)local_418);
        goto LAB_0011bc75;
      }
      goto LAB_0011bd10;
    }
    this = (overflow_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)this,(char *)local_418);
  }
  else {
    if (ec < 0x21) {
      if (ec == 0xc) {
        this = (overflow_error *)__cxa_allocate_exception(8);
        *(code **)this = std::ios::widen;
        pcVar5 = std::bad_alloc::~bad_alloc;
        puVar6 = &std::bad_alloc::typeinfo;
        goto LAB_0011bd3b;
      }
      if (ec == 0x16) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument((invalid_argument *)this,(char *)local_418);
        pcVar5 = std::invalid_argument::~invalid_argument;
        puVar6 = &std::invalid_argument::typeinfo;
        goto LAB_0011bd3b;
      }
    }
    else {
      if (ec == 0x21) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error((domain_error *)this,(char *)local_418);
        pcVar5 = std::domain_error::~domain_error;
        puVar6 = &std::domain_error::typeinfo;
        goto LAB_0011bd3b;
      }
      if (ec == 0x22) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range((out_of_range *)this,(char *)local_418);
        pcVar5 = std::out_of_range::~out_of_range;
        puVar6 = &std::out_of_range::typeinfo;
        goto LAB_0011bd3b;
      }
      if (ec == 0x4b) {
        this = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this,(char *)local_418);
        pcVar5 = std::overflow_error::~overflow_error;
        puVar6 = &std::overflow_error::typeinfo;
        goto LAB_0011bd3b;
      }
    }
LAB_0011bd10:
    this = (overflow_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)this,(char *)local_418);
  }
  pcVar5 = std::runtime_error::~runtime_error;
  puVar6 = &std::runtime_error::typeinfo;
LAB_0011bd3b:
  __cxa_throw(this,puVar6,pcVar5);
}

Assistant:

void fail(int ec, const char* file, unsigned line, const char* exp, const char* fmt, ...) {
	POTASSCO_CHECK(ec != 0, EINVAL, "error code must not be 0");
	char msg[1024];
	StringBuilder str(msg, sizeof(msg));
	if (ec > 0 || ec == error_assert) {
		if (file && line) { str.appendFormat("%s@%u: ", file, line); }
		str.append(ec > 0 ? strerror(ec) : "assertion failure");
		str.append(": ");
	}
	else if (!fmt) {
		str.appendFormat("%s error: ", ec == error_logic ? "logic" : "runtime");
	}
	if (fmt) {
		va_list args;
		va_start(args, fmt);
		char* pos = msg + str.size();
		size_t sz = sizeof(msg) - str.size();
		vsnprintf(pos, sz, fmt, args);
		va_end(args);
	}
	else if (exp) {
		str.appendFormat("check('%s') failed", exp);
	}
	switch (ec) {
		case error_logic  : throw std::logic_error(msg);
		case error_assert : throw std::logic_error(msg);
		case error_runtime: throw std::runtime_error(msg);
		case E2BIG        : throw std::length_error(msg);
		case ENOMEM       : throw std::bad_alloc();
		case EINVAL       : throw std::invalid_argument(msg);
		case EDOM         : throw std::domain_error(msg);
		case ERANGE       : throw std::out_of_range(msg);
#if defined(EOVERFLOW)
		case EOVERFLOW    : throw std::overflow_error(msg);
#endif
		default           : throw std::runtime_error(msg);
	}
}